

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

bool __thiscall Imath_3_2::Matrix44<float>::operator!=(Matrix44<float> *this,Matrix44<float> *v)

{
  float *pfVar1;
  float fVar2;
  
  fVar2 = this->x[0][0];
  if ((((((((fVar2 == v->x[0][0]) && (!NAN(fVar2) && !NAN(v->x[0][0]))) &&
          (fVar2 = this->x[0][1], pfVar1 = v->x[0] + 1, fVar2 == *pfVar1)) &&
         (((!NAN(fVar2) && !NAN(*pfVar1) &&
           (fVar2 = this->x[0][2], pfVar1 = v->x[0] + 2, fVar2 == *pfVar1)) &&
          ((!NAN(fVar2) && !NAN(*pfVar1) &&
           ((fVar2 = this->x[0][3], pfVar1 = v->x[0] + 3, fVar2 == *pfVar1 &&
            (!NAN(fVar2) && !NAN(*pfVar1))))))))) && (fVar2 = this->x[1][0], fVar2 == v->x[1][0]))
       && (((!NAN(fVar2) && !NAN(v->x[1][0]) &&
            (fVar2 = this->x[1][1], pfVar1 = v->x[1] + 1, fVar2 == *pfVar1)) &&
           (!NAN(fVar2) && !NAN(*pfVar1))))) &&
      (((fVar2 = this->x[1][2], pfVar1 = v->x[1] + 2, fVar2 == *pfVar1 &&
        (!NAN(fVar2) && !NAN(*pfVar1))) &&
       ((fVar2 = this->x[1][3], pfVar1 = v->x[1] + 3, fVar2 == *pfVar1 &&
        ((!NAN(fVar2) && !NAN(*pfVar1) && (fVar2 = this->x[2][0], fVar2 == v->x[2][0])))))))) &&
     (((!NAN(fVar2) && !NAN(v->x[2][0]) &&
       (((((fVar2 = this->x[2][1], pfVar1 = v->x[2] + 1, fVar2 == *pfVar1 &&
           (!NAN(fVar2) && !NAN(*pfVar1))) &&
          (fVar2 = this->x[2][2], pfVar1 = v->x[2] + 2, fVar2 == *pfVar1)) &&
         ((!NAN(fVar2) && !NAN(*pfVar1) &&
          (fVar2 = this->x[2][3], pfVar1 = v->x[2] + 3, fVar2 == *pfVar1)))) &&
        ((!NAN(fVar2) && !NAN(*pfVar1) &&
         ((fVar2 = this->x[3][0], fVar2 == v->x[3][0] && (!NAN(fVar2) && !NAN(v->x[3][0]))))))))) &&
      ((fVar2 = this->x[3][1], pfVar1 = v->x[3] + 1, fVar2 == *pfVar1 &&
       (((!NAN(fVar2) && !NAN(*pfVar1) &&
         (fVar2 = this->x[3][2], pfVar1 = v->x[3] + 2, fVar2 == *pfVar1)) &&
        (!NAN(fVar2) && !NAN(*pfVar1))))))))) {
    return (bool)(-(v->x[3][3] != this->x[3][3]) & 1);
  }
  return true;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline bool
Matrix44<T>::operator!= (const Matrix44& v) const IMATH_NOEXCEPT
{
    return x[0][0] != v.x[0][0] || x[0][1] != v.x[0][1] ||
           x[0][2] != v.x[0][2] || x[0][3] != v.x[0][3] ||
           x[1][0] != v.x[1][0] || x[1][1] != v.x[1][1] ||
           x[1][2] != v.x[1][2] || x[1][3] != v.x[1][3] ||
           x[2][0] != v.x[2][0] || x[2][1] != v.x[2][1] ||
           x[2][2] != v.x[2][2] || x[2][3] != v.x[2][3] ||
           x[3][0] != v.x[3][0] || x[3][1] != v.x[3][1] ||
           x[3][2] != v.x[3][2] || x[3][3] != v.x[3][3];
}